

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

void __thiscall
HtmlModelSerialiserPrivate::writeHtmlVariant
          (HtmlModelSerialiserPrivate *this,QXmlStreamWriter *writer,QVariant *val)

{
  QVariant *pQVar1;
  bool bVar2;
  int val_00;
  QString local_1c0;
  QArrayDataPointer<char16_t> local_1a8;
  QString local_190;
  QArrayDataPointer<char16_t> local_178;
  QString local_160;
  QString local_148;
  QLatin1String local_130;
  QString local_120;
  QString local_108;
  QArrayDataPointer<char16_t> local_f0;
  QString local_d8;
  QArrayDataPointer<char16_t> local_b0;
  QString local_98;
  QVariant *local_80;
  QVariant *val_local;
  QXmlStreamWriter *writer_local;
  HtmlModelSerialiserPrivate *this_local;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_10;
  
  local_80 = val;
  val_local = (QVariant *)writer;
  writer_local = (QXmlStreamWriter *)this;
  val_00 = ::QVariant::userType(val);
  bVar2 = isImageType(val_00);
  pQVar1 = val_local;
  if (bVar2) {
    str = L"img";
    local_38 = L"img";
    local_28 = &local_b0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b0,(Data *)0x0,L"img",3);
    QString::QString(&local_98,&local_b0);
    QXmlStreamWriter::writeEmptyElement((QString *)pQVar1);
    QString::~QString(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    pQVar1 = val_local;
    str_1 = L"src";
    local_50 = L"src";
    local_40 = &local_f0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_f0,(Data *)0x0,L"src",3);
    QString::QString(&local_d8,&local_f0);
    QLatin1String::QLatin1String(&local_130,"data:image/png;base64,");
    QString::QString(&local_120,local_130);
    AbstractStringSerialiserPrivate::saveVariant
              (&local_148,&this->super_AbstractStringSerialiserPrivate,local_80);
    operator+(&local_108,&local_120,&local_148);
    QXmlStreamWriter::writeAttribute((QString *)pQVar1,(QString *)&local_d8);
    QString::~QString(&local_108);
    QString::~QString(&local_148);
    QString::~QString(&local_120);
    QString::~QString(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    pQVar1 = val_local;
    str_2 = L"alt";
    this_local = (HtmlModelSerialiserPrivate *)anon_var_dwarf_74a69;
    local_58 = &local_178;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_178,(Data *)0x0,L"alt",3);
    QString::QString(&local_160,&local_178);
    local_10 = &local_1a8;
    str_3 = L"modelimage.png";
    local_20 = L"modelimage.png";
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1a8,(Data *)0x0,L"modelimage.png",0xe);
    QString::QString(&local_190,&local_1a8);
    QXmlStreamWriter::writeAttribute((QString *)pQVar1,(QString *)&local_160);
    QString::~QString(&local_190);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
    QString::~QString(&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  }
  else {
    AbstractStringSerialiserPrivate::saveVariant
              (&local_1c0,&this->super_AbstractStringSerialiserPrivate,local_80);
    QXmlStreamWriter::writeCharacters((QString *)pQVar1);
    QString::~QString(&local_1c0);
  }
  return;
}

Assistant:

void HtmlModelSerialiserPrivate::writeHtmlVariant(QXmlStreamWriter &writer, const QVariant &val) const
{
    if (isImageType(val.userType())) {
        writer.writeEmptyElement(QStringLiteral("img"));
        writer.writeAttribute(QStringLiteral("src"), QLatin1String("data:image/png;base64,") + saveVariant(val));
        writer.writeAttribute(QStringLiteral("alt"), QStringLiteral("modelimage.png"));
        return;
    }
    writer.writeCharacters(saveVariant(val));
}